

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O2

int64_t av1_interpolation_filter_search
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *tmp_dst,BUFFER_SET *orig_dst,int64_t *rd,int *switchable_rate,
                  int *skip_build_pred,HandleInterModeArgs *args,int64_t ref_best_rd)

{
  MACROBLOCKD *pMVar1;
  int8_t *piVar2;
  MV_REFERENCE_FRAME *pMVar3;
  uint8_t uVar4;
  InterpFilter IVar5;
  COMPOUND_TYPE CVar6;
  undefined2 uVar7;
  ushort uVar8;
  int64_t (*paaiVar9) [3] [8];
  MB_MODE_INFO *pMVar10;
  SequenceHeader *pSVar11;
  macroblockd_plane *pmVar12;
  char cVar13;
  MACROBLOCK *pMVar14;
  INTERP_PRED_TYPE IVar15;
  int plane_idx;
  int iVar16;
  ulong uVar17;
  scale_factors *psVar18;
  int *switchable_ctx_00;
  int64_t iVar19;
  ulong uVar20;
  InterpFilter IVar21;
  byte bVar22;
  BLOCK_SIZE bsize_00;
  uint num_planes;
  uint uVar23;
  long lVar24;
  buf_2d *pbVar25;
  byte bVar26;
  uint uVar27;
  TileDataEnc *tile_data_00;
  long lVar28;
  uint uVar29;
  BUFFER_SET **ppBVar30;
  int iVar31;
  int *piVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  uint8_t *puVar37;
  int8_t *piVar38;
  undefined1 *puVar39;
  int skip_pred;
  int iVar40;
  uint uVar41;
  uint uVar42;
  long lVar43;
  BUFFER_SET **ppBVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  int *piVar48;
  bool bVar49;
  bool bVar50;
  uint16_t allow_interp_mask;
  undefined8 uVar51;
  int in_stack_fffffffffffffe68;
  int_interpfilters af;
  char local_175;
  uint local_174;
  BUFFER_SET *local_170;
  MB_MODE_INFO *local_168;
  MACROBLOCK *local_160;
  int local_158;
  int switchable_ctx [2];
  uint local_148;
  int_interpfilters local_12c;
  MACROBLOCKD *local_128;
  INTERPOLATION_FILTER_STATS *local_120;
  long local_118;
  uint local_10c;
  uint local_108;
  int local_104;
  ulong local_100;
  MB_MODE_INFO **local_f8;
  BUFFER_SET *local_f0;
  BUFFER_SET *dst_bufs [2];
  int aiStack_d0 [6];
  RD_STATS rd_stats_luma;
  RD_STATS rd_stats;
  
  uVar4 = ((cpi->common).seq_params)->monochrome;
  local_168 = *(x->e_mbd).mi;
  local_174 = CONCAT31(local_174._1_3_,uVar4);
  if (((*(ushort *)&local_168->field_0xa7 & 0x40) == 0) && (local_168->motion_mode != '\x02')) {
    bVar49 = true;
    if ((local_168->mode == '\x17') || (local_168->mode == '\x0f')) {
      bVar22 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [local_168->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [local_168->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [local_168->bsize]) {
        bVar22 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [local_168->bsize];
      }
      if (1 < bVar22) {
        lVar43 = (ulong)('\0' < local_168->ref_frame[1]) + 1;
        lVar24 = 0;
        do {
          lVar28 = lVar24;
          bVar49 = lVar43 != lVar28;
          if (lVar43 == lVar28) break;
          lVar24 = lVar28 + 1;
        } while ((x->e_mbd).global_motion[local_168->ref_frame[lVar28]].wmtype != '\x01');
        bVar50 = lVar43 == lVar28;
        goto LAB_0034fa8d;
      }
    }
    bVar50 = false;
  }
  else {
    bVar49 = false;
    bVar50 = true;
  }
LAB_0034fa8d:
  local_118 = (long)local_168->ref_frame[0];
  rd_stats_luma.rate = 0;
  rd_stats_luma.zero_rate = 0;
  rd_stats_luma.dist = 0;
  rd_stats_luma.rdcost = 0;
  rd_stats_luma.sse = 0;
  rd_stats_luma.skip_txfm = '\x01';
  rd_stats.rate = 0;
  rd_stats.zero_rate = 0;
  rd_stats.dist = 0;
  rd_stats.rdcost = 0;
  rd_stats.sse = 0;
  rd_stats.skip_txfm = '\x01';
  IVar5 = (cpi->common).features.interp_filter;
  local_120 = args->interp_filter_stats;
  iVar16 = (cpi->sf).interp_sf.use_interp_filter;
  if (bVar49 && (long)iVar16 != 0) {
    local_158 = CONCAT31(local_158._1_3_,IVar5);
    bVar49 = '\0' < local_168->ref_frame[1];
    uVar36 = (ulong)bVar49;
    lVar24 = uVar36 + 1;
    uVar35 = 0;
    uVar20 = (ulong)(uint)args->interp_filter_stats_idx;
    if (args->interp_filter_stats_idx < 1) {
      uVar20 = uVar35;
    }
    local_148 = *(ushort *)&local_168->field_0xa7 >> 9 & 1;
    piVar38 = args->interp_filter_stats[0].ref_frames;
    puVar39 = (undefined1 *)((long)args->interp_filter_stats[0].mv + 2);
    iVar31 = 0x7fffffff;
    uVar17 = 0xffffffffffffffff;
LAB_0034fb9c:
    iVar40 = (int)uVar17;
    if (uVar35 != uVar20) {
      lVar43 = 0;
LAB_0034fbb1:
      if (lVar24 != lVar43) goto code_r0x0034fbb6;
      if ((!bVar49 || iVar16 != 1) ||
         ((local_120[uVar35].comp_type == (local_168->interinter_comp).type &&
          (local_120[uVar35].compound_idx == local_148)))) {
        iVar40 = 0;
        for (lVar43 = 0; lVar24 != lVar43; lVar43 = lVar43 + 1) {
          uVar46 = (int)*(short *)(puVar39 + lVar43 * 4 + -2) - (int)local_168->mv[lVar43].as_mv.row
          ;
          uVar33 = -uVar46;
          if (0 < (int)uVar46) {
            uVar33 = uVar46;
          }
          uVar47 = (int)*(short *)(puVar39 + lVar43 * 4) -
                   (int)*(short *)((long)local_168->mv + lVar43 * 4 + 2);
          uVar46 = -uVar47;
          if (0 < (int)uVar47) {
            uVar46 = uVar47;
          }
          iVar40 = (uVar33 & 0xffff) + iVar40 + (uVar46 & 0xffff);
        }
        if (iVar40 == 0) {
          iVar40 = (int)uVar35;
          goto LAB_0034fccf;
        }
        if (iVar40 < iVar31) {
          if (iVar40 <= *(int *)(find_best_non_dual_interp_filter_thr +
                                (long)iVar16 * 8 + uVar36 * 4 + 0x18)) {
            uVar17 = uVar35;
          }
          uVar17 = uVar17 & 0xffffffff;
          if (iVar40 <= *(int *)(find_best_non_dual_interp_filter_thr +
                                (long)iVar16 * 8 + uVar36 * 4 + 0x18)) {
            iVar31 = iVar40;
          }
        }
      }
      goto LAB_0034fc56;
    }
    local_160 = x;
    if (iVar40 != -1) {
LAB_0034fccf:
      local_168->interp_filters = local_120[iVar40].filters;
      local_160 = x;
      if (iVar40 != -1) {
        *rd = local_120[iVar40].rd;
        x->pred_sse[local_118] = local_120[iVar40].pred_sse;
        *skip_build_pred = 0;
        return 0;
      }
    }
  }
  pMVar1 = &x->e_mbd;
  IVar21 = IVar5;
  if (IVar5 == MULTITAP_SHARP2) {
    IVar21 = EIGHTTAP_REGULAR;
  }
  (local_168->interp_filters).as_int = (uint)IVar21 * 0x10001;
  local_170 = orig_dst;
  local_f0 = tmp_dst;
  iVar16 = av1_get_pred_context_switchable_interp(pMVar1,0);
  switchable_ctx[0] = iVar16;
  local_128 = pMVar1;
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(pMVar1,1);
  iVar16 = (x->mode_costs).switchable_interp_costs[iVar16]
           [(local_168->interp_filters).as_int & 0xff];
  if (((cpi->common).seq_params)->enable_dual_filter != '\0') {
    iVar16 = iVar16 + *(int *)((long)(x->mode_costs).switchable_interp_costs[switchable_ctx[1]] +
                              (ulong)((local_168->interp_filters).as_int >> 0xe & 0x3fc));
  }
  cVar13 = (char)local_174;
  *switchable_rate = iVar16;
  tile_data_00 = (TileDataEnc *)(ulong)bsize;
  interp_model_rd_eval(x,cpi,bsize,local_170,0,0,&rd_stats_luma,*skip_build_pred);
  if (cVar13 == '\0') {
    interp_model_rd_eval(x,cpi,bsize,local_170,1,2,&rd_stats,*skip_build_pred);
  }
  *skip_build_pred = 1;
  av1_merge_rd_stats(&rd_stats,&rd_stats_luma);
  pMVar1 = local_128;
  lVar24 = rd_stats.dist * 0x80 +
           ((long)x->rdmult * ((long)rd_stats.rate + (long)*switchable_rate) + 0x100 >> 9);
  *rd = lVar24;
  x->pred_sse[local_118] = (uint)((ulong)rd_stats_luma.sse >> 4);
  if (bVar50 || IVar5 != MULTITAP_SHARP2) {
    return 0;
  }
  paaiVar9 = args->modelled_rd;
  if ((paaiVar9 != (int64_t (*) [3] [8])0x0) && (0 < (long)local_168->ref_frame[1])) {
    uVar33 = (*(ushort *)&local_168->field_0xa7 & 0x30) << 2;
    lVar43 = *(long *)((long)paaiVar9[(byte)compound_ref0_mode_lut[local_168->mode]][0] +
                      (long)local_168->ref_frame[0] * 8 + (ulong)uVar33);
    lVar28 = *(long *)((long)paaiVar9[(byte)compound_ref1_mode_lut[local_168->mode]][0] +
                      (long)local_168->ref_frame[1] * 8 + (ulong)uVar33);
    if (lVar43 < lVar28) {
      lVar28 = lVar43;
    }
    if ((ref_best_rd != 0x7fffffffffffffff) && (lVar28 < lVar24 >> 1)) {
      return 0x7fffffffffffffff;
    }
  }
  x->recalc_luma_mc_data = 0;
  num_planes = (uint)(uVar4 == '\0') * 2 + 1;
  local_f8 = (x->e_mbd).mi;
  pMVar10 = *local_f8;
  pSVar11 = (cpi->common).seq_params;
  local_175 = pMVar10->ref_frame[1];
  uVar33 = (cpi->interp_search_flags).default_interp_skip_flags;
  local_100 = (ulong)uVar33;
  uVar46 = uVar33;
  uVar47 = uVar33;
  for (lVar24 = 0; uVar42 = uVar47, uVar45 = uVar46, lVar24 != (ulong)('\0' < local_175) + 1;
      lVar24 = lVar24 + 1) {
    if (((byte)(pMVar10->ref_frame[lVar24] - 1U) < 8) &&
       (iVar16 = (cpi->common).remapped_ref_idx[(byte)pMVar10->ref_frame[lVar24] - 1], iVar16 != -1)
       ) {
      psVar18 = (cpi->common).ref_scale_factors + iVar16;
    }
    else {
      psVar18 = (scale_factors *)0x0;
    }
    if ((psVar18->x_scale_fp != -1) && (psVar18->y_scale_fp != -1)) {
      piVar32 = (int *)0x0;
      if (psVar18->x_scale_fp != 0x4000) {
        piVar48 = (int *)0x0;
        goto LAB_003501f1;
      }
      piVar48 = (int *)0x0;
      if (psVar18->y_scale_fp != 0x4000) goto LAB_003501f1;
    }
    local_174 = pMVar10->mv[lVar24].as_int >> 0x10;
    local_158 = (x->e_mbd).mb_to_top_edge;
    local_104 = (x->e_mbd).mb_to_bottom_edge;
    uVar46 = 0;
    uVar47 = 0;
    puVar37 = &(x->e_mbd).plane[0].height;
    for (lVar43 = 0; (ulong)(pSVar11->monochrome == '\0') + 1 != lVar43; lVar43 = lVar43 + 1) {
      bVar26 = 1 - (byte)*(int *)(puVar37 + -0xa1);
      bVar22 = 1 - (byte)*(int *)(puVar37 + -0xa5);
      uVar34 = (x->e_mbd).mb_to_left_edge << (bVar22 & 0x1f);
      uVar41 = (uint)puVar37[-1] * 0x10 + ((x->e_mbd).mb_to_right_edge << (bVar22 & 0x1f)) + 0x30;
      uVar29 = local_158 << (bVar26 & 0x1f);
      uVar23 = (uint)(short)(local_174 << (bVar22 & 0x1f));
      if ((int)uVar23 < (int)uVar41) {
        uVar41 = uVar23;
      }
      uVar27 = (uint)*puVar37 * 0x10 + 0x30 + (local_104 << (bVar26 & 0x1f));
      if ((int)uVar23 < (int)(uVar34 + (uint)puVar37[-1] * -0x10 + -0x40)) {
        uVar41 = uVar34;
      }
      uVar23 = (uint)(short)(pMVar10->mv[lVar24].as_int << (bVar26 & 0x1f));
      if ((int)uVar23 < (int)uVar27) {
        uVar27 = uVar23;
      }
      if ((int)uVar23 < (int)(uVar29 + (uint)*puVar37 * -0x10 + -0x40)) {
        uVar27 = uVar29;
      }
      uVar47 = uVar47 | (uint)((uVar41 & 0xf) == 0) << ((byte)lVar43 & 0x1f);
      uVar46 = uVar46 | (uint)((uVar27 & 0xf) == 0) << ((byte)lVar43 & 0x1f);
      puVar37 = puVar37 + 0xa30;
    }
    uVar46 = uVar45 & uVar46;
    uVar47 = uVar42 & uVar47;
    local_10c = uVar42;
    local_108 = uVar45;
  }
  piVar32 = (int *)(ulong)uVar45;
  piVar48 = (int *)(ulong)uVar42;
LAB_003501f1:
  uVar46 = (uint)piVar32;
  uVar47 = (uint)piVar48;
  if (('\0' < local_175) && ((pMVar10->field_0xa8 & 2) != 0)) {
    uVar45 = 0;
    if (uVar46 != 1 || uVar47 != 0) {
      uVar45 = uVar46;
    }
    if ((pMVar10->interinter_comp).type != '\x03') {
      uVar45 = uVar46;
    }
    piVar32 = (int *)(ulong)uVar45;
  }
  dst_bufs[0] = (BUFFER_SET *)local_f0->plane[0];
  dst_bufs[1] = (BUFFER_SET *)local_f0->plane[1];
  pmVar12 = (x->e_mbd).plane;
  iVar16 = 6;
  for (lVar24 = 6; pbVar25 = &pmVar12->dst, lVar24 - (ulong)num_planes != 6; lVar24 = lVar24 + 1) {
    pbVar25->buf = (uint8_t *)(&local_118)[lVar24];
    pbVar25->stride = *(int *)((long)dst_bufs + lVar24 * 4);
    pmVar12 = (macroblockd_plane *)(pbVar25 + 0x51);
  }
  dst_bufs[0] = local_f0;
  dst_bufs[1] = local_170;
  uVar46 = (uint)piVar32;
  if (pSVar11->enable_dual_filter == '\0') {
    pMVar10 = *local_f8;
    uVar45 = (uint)(cpi->interp_search_flags).interp_filter_search_mask;
    local_160 = x;
    iVar16 = 6;
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
      uVar20 = (ulong)(cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
      local_174 = av1_get_pred_context_switchable_interp(local_128,0);
      uVar51 = 0x3503e6;
      iVar16 = av1_get_pred_context_switchable_interp(pMVar1,1);
      for (lVar24 = 0; lVar24 != 0xc; lVar24 = lVar24 + 4) {
        if ((*(int *)((long)(cpi->ppi->frame_probs).switchable_interp_probs[uVar20][(int)local_174]
                     + lVar24) < *(int *)(find_best_non_dual_interp_filter_thr + uVar20 * 4)) &&
           (*(int *)((long)(cpi->ppi->frame_probs).switchable_interp_probs[uVar20][iVar16] + lVar24)
            < *(int *)(find_best_non_dual_interp_filter_thr + uVar20 * 4))) {
          uVar51 = 1;
          uVar45 = uVar45 & (1 << ((byte)lVar24 & 0x1f) & 0x111U ^ 0x1ff);
        }
      }
      uVar33 = (cpi->interp_search_flags).default_interp_skip_flags;
      iVar16 = (int)uVar51;
    }
    uVar42 = uVar46 & uVar47;
    piVar32 = (int *)(ulong)uVar42;
    if (uVar42 != uVar33) {
      af.as_int = 0xff00ff;
      local_12c.as_int = 0xff00ff;
      iVar16 = 0x3505b3;
      IVar15 = is_pred_filter_search_allowed(cpi,local_128,bsize,&af,&local_12c);
      if (IVar15 != '\0') {
        if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 0) {
          if (af.as_filters.x_filter == 0) goto LAB_00350695;
        }
        else if (af.as_filters.x_filter == 0 ||
                 (uVar45 >> ((af.as_filters.x_filter & 7) << 2) & 1) == 0) goto LAB_00350695;
        interpolation_filter_rd
                  (local_160,cpi,tile_data_00,(BLOCK_SIZE)local_170,(BUFFER_SET *)rd,
                   (int64_t *)&rd_stats_luma,&rd_stats,(RD_STATS *)switchable_rate,(int *)dst_bufs,
                   (BUFFER_SET **)((ulong)af.as_filters.x_filter << 2),(int)switchable_ctx,piVar32,
                   in_stack_fffffffffffffe68);
        goto LAB_00350695;
      }
    }
    if (((bsize != BLOCK_4X4) &&
        (((0x10003UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0 || (uVar33 != uVar46)))) &&
       (((0x20005UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0 || (uVar33 != uVar47)))) {
      ppBVar44 = (BUFFER_SET **)&DAT_00000004;
      while ((uVar33 = (uint)ppBVar44, uVar33 < 9 &&
             (((((cpi->sf).interp_sf.adaptive_interp_filter_search != 0 &&
                ((uVar45 >> (uVar33 & 0x1f) & 1) == 0)) ||
               (interpolation_filter_rd
                          (local_160,cpi,tile_data_00,(BLOCK_SIZE)local_170,(BUFFER_SET *)rd,
                           (int64_t *)&rd_stats_luma,&rd_stats,(RD_STATS *)switchable_rate,
                           (int *)dst_bufs,ppBVar44,(int)switchable_ctx,piVar32,
                           in_stack_fffffffffffffe68),
               (cpi->sf).interp_sf.skip_sharp_interp_filter_search == 0)) ||
              ((uVar42 == (cpi->interp_search_flags).default_interp_skip_flags ||
               ((pMVar10->interp_filters).as_int != 0x10001))))))) {
        ppBVar44 = (BUFFER_SET **)(ulong)(uVar33 + 4);
      }
      goto LAB_00350695;
    }
    uVar33 = uVar45 & 0x110;
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 0) {
      uVar33 = 0x110;
    }
    bsize_00 = (BLOCK_SIZE)local_170;
    allow_interp_mask = 1;
    x = local_160;
  }
  else {
    if ((cpi->sf).interp_sf.use_fast_interpolation_filter_search != 0) {
      af.as_int = 0xff00ff;
      local_12c.as_int = 0xff00ff;
      if ((0x18 < (*local_f8)->mode) ||
         (local_160 = x, (0x1790000U >> ((*local_f8)->mode & 0x1f) & 1) == 0)) {
        iVar16 = 0x3507d1;
        local_160 = x;
        IVar15 = is_pred_filter_search_allowed(cpi,local_128,bsize,&af,&local_12c);
        if (IVar15 != '\0') {
          if (IVar15 == '\x02') {
            uVar33 = (uint)av1_interp_dual_filt_mask[1][af.as_filters.y_filter];
          }
          else if (IVar15 == '\x01') {
            uVar33 = (uint)av1_interp_dual_filt_mask[0][af.as_filters.x_filter];
          }
          else {
            iVar16 = 1;
            uVar33 = 1 << ((char)af.as_int * '\x03' + (char)((uint)af >> 0x10) & 0x1fU);
          }
          uVar33 = uVar33 & 0x1fe;
          bsize_00 = (BLOCK_SIZE)local_170;
          goto LAB_00350561;
        }
      }
      switchable_ctx_00 = (int *)(local_100 & 0xffffffff);
      if ((0x10003UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0) {
        switchable_ctx_00 = piVar48;
      }
      ppBVar44 = (BUFFER_SET **)0x2;
      ppBVar30 = (BUFFER_SET **)0x0;
      uVar33 = 2;
      while (bVar49 = uVar33 != 0, uVar33 = uVar33 - 1, bVar49) {
        iVar19 = interpolation_filter_rd
                           (local_160,cpi,tile_data_00,(BLOCK_SIZE)local_170,(BUFFER_SET *)rd,
                            (int64_t *)&rd_stats_luma,&rd_stats,(RD_STATS *)switchable_rate,
                            (int *)dst_bufs,ppBVar44,(int)switchable_ctx,switchable_ctx_00,
                            in_stack_fffffffffffffe68);
        if (iVar19 != 0) {
          ppBVar30 = ppBVar44;
        }
        ppBVar44 = (BUFFER_SET **)(ulong)uVar33;
        switchable_ctx_00 = piVar48;
      }
      piVar48 = piVar32;
      if ((0x20005UL >> ((ulong)tile_data_00 & 0x3f) & 1) != 0) {
        piVar48 = (int *)(ulong)(uint)(cpi->interp_search_flags).default_interp_skip_flags;
      }
      for (uVar33 = (int)ppBVar30 + 6; (int)ppBVar30 + 3 <= (int)uVar33; uVar33 = uVar33 - 3) {
        interpolation_filter_rd
                  (local_160,cpi,tile_data_00,(BLOCK_SIZE)local_170,(BUFFER_SET *)rd,
                   (int64_t *)&rd_stats_luma,&rd_stats,(RD_STATS *)switchable_rate,(int *)dst_bufs,
                   (BUFFER_SET **)(ulong)uVar33,(int)switchable_ctx,piVar48,
                   in_stack_fffffffffffffe68);
        piVar48 = piVar32;
      }
      goto LAB_00350695;
    }
    bsize_00 = (BLOCK_SIZE)local_170;
    uVar33 = 0x1fe;
    local_160 = x;
LAB_00350561:
    allow_interp_mask = 0;
    piVar32 = (int *)(ulong)(uVar46 & uVar47);
  }
  find_best_interp_rd_facade
            (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&rd_stats_luma,&rd_stats,
             (RD_STATS *)switchable_rate,(int *)dst_bufs,(BUFFER_SET **)switchable_ctx,piVar32,
             uVar33,allow_interp_mask,iVar16);
LAB_00350695:
  pMVar1 = local_128;
  swap_dst_buf(local_128,dst_bufs,num_planes);
  pMVar14 = local_160;
  if (local_160->recalc_luma_mc_data == 1) {
    av1_enc_build_inter_predictor
              (&cpi->common,pMVar1,(local_160->e_mbd).mi_row,(local_160->e_mbd).mi_col,local_170,
               bsize,0,0);
  }
  uVar33 = (uint)((ulong)rd_stats_luma.sse >> 4);
  pMVar14->pred_sse[local_118] = uVar33;
  if ((cpi->sf).interp_sf.use_interp_filter != 0) {
    iVar16 = args->interp_filter_stats_idx;
    lVar24 = (long)iVar16;
    if (lVar24 < 0x80) {
      iVar19 = *rd;
      uVar7 = *(undefined2 *)local_168->ref_frame;
      CVar6 = (local_168->interinter_comp).type;
      uVar8 = *(ushort *)&local_168->field_0xa7;
      uVar51 = *(undefined8 *)local_168->mv;
      local_120[lVar24].filters = local_168->interp_filters;
      *(undefined8 *)local_120[lVar24].mv = uVar51;
      *(undefined2 *)local_120[lVar24].ref_frames = uVar7;
      local_120[lVar24].comp_type = CVar6;
      local_120[lVar24].compound_idx = uVar8 >> 9 & 1;
      local_120[lVar24].rd = iVar19;
      local_120[lVar24].pred_sse = uVar33;
      iVar16 = iVar16 + 1;
    }
    args->interp_filter_stats_idx = iVar16;
  }
  return 0;
code_r0x0034fbb6:
  piVar2 = piVar38 + lVar43;
  pMVar3 = local_168->ref_frame + lVar43;
  lVar43 = lVar43 + 1;
  if (*piVar2 != *pMVar3) goto LAB_0034fc56;
  goto LAB_0034fbb1;
LAB_0034fc56:
  uVar35 = uVar35 + 1;
  piVar38 = piVar38 + 0x28;
  puVar39 = puVar39 + 0x28;
  goto LAB_0034fb9c;
}

Assistant:

int64_t av1_interpolation_filter_search(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const tmp_dst, const BUFFER_SET *const orig_dst,
    int64_t *const rd, int *const switchable_rate, int *skip_build_pred,
    HandleInterModeArgs *args, int64_t ref_best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int need_search = av1_is_interp_needed(xd);
  const int ref_frame = xd->mi[0]->ref_frame[0];
  RD_STATS rd_stats_luma, rd_stats;

  // Initialization of rd_stats structures with default values
  av1_init_rd_stats(&rd_stats_luma);
  av1_init_rd_stats(&rd_stats);

  int match_found_idx = -1;
  const InterpFilter assign_filter = cm->features.interp_filter;

  match_found_idx = find_interp_filter_match(
      mbmi, cpi, assign_filter, need_search, args->interp_filter_stats,
      args->interp_filter_stats_idx);

  if (match_found_idx != -1) {
    *rd = args->interp_filter_stats[match_found_idx].rd;
    x->pred_sse[ref_frame] =
        args->interp_filter_stats[match_found_idx].pred_sse;
    *skip_build_pred = 0;
    return 0;
  }

  int switchable_ctx[2];
  switchable_ctx[0] = av1_get_pred_context_switchable_interp(xd, 0);
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(xd, 1);
  *switchable_rate =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  // Do MC evaluation for default filter_type.
  // Luma MC
  interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                       &rd_stats_luma, *skip_build_pred);

#if CONFIG_COLLECT_RD_STATS == 3
  RD_STATS rd_stats_y;
  av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize, INT64_MAX);
  PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
  // Chroma MC
  if (num_planes > 1) {
    interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_U, AOM_PLANE_V,
                         &rd_stats, *skip_build_pred);
  }
  *skip_build_pred = 1;

  av1_merge_rd_stats(&rd_stats, &rd_stats_luma);

  assert(rd_stats.rate >= 0);

  *rd = RDCOST(x->rdmult, *switchable_rate + rd_stats.rate, rd_stats.dist);
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  if (assign_filter != SWITCHABLE || match_found_idx != -1) {
    return 0;
  }
  if (!need_search) {
    int_interpfilters filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    assert(mbmi->interp_filters.as_int == filters.as_int);
    (void)filters;
    return 0;
  }
  if (args->modelled_rd != NULL) {
    if (has_second_ref(mbmi)) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      MV_REFERENCE_FRAME *refs = mbmi->ref_frame;
      const int mode0 = compound_ref0_mode(mbmi->mode);
      const int mode1 = compound_ref1_mode(mbmi->mode);
      const int64_t mrd = AOMMIN(args->modelled_rd[mode0][ref_mv_idx][refs[0]],
                                 args->modelled_rd[mode1][ref_mv_idx][refs[1]]);
      if ((*rd >> 1) > mrd && ref_best_rd < INT64_MAX) {
        return INT64_MAX;
      }
    }
  }

  x->recalc_luma_mc_data = 0;
  // skip_flag=xx (in binary form)
  // Setting 0th flag corresonds to skipping luma MC and setting 1st bt
  // corresponds to skipping chroma MC  skip_flag=0 corresponds to "Don't skip
  // luma and chroma MC"  Skip flag=1 corresponds to "Skip Luma MC only"
  // Skip_flag=2 is not a valid case
  // skip_flag=3 corresponds to "Skip both luma and chroma MC"
  int skip_hor = interp_search_flags->default_interp_skip_flags;
  int skip_ver = interp_search_flags->default_interp_skip_flags;
  calc_interp_skip_pred_flag(x, cpi, &skip_hor, &skip_ver);

  // do interp_filter search
  restore_dst_buf(xd, *tmp_dst, num_planes);
  const BUFFER_SET *dst_bufs[2] = { tmp_dst, orig_dst };
  // Evaluate dual interp filters
  if (cm->seq_params->enable_dual_filter) {
    if (cpi->sf.interp_sf.use_fast_interpolation_filter_search) {
      fast_dual_interp_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx, skip_hor, skip_ver);
    } else {
      // Use full interpolation filter search
      uint16_t allowed_interp_mask = ALLOW_ALL_INTERP_FILT_MASK;
      // REG_REG filter type is evaluated beforehand, so loop is repeated over
      // REG_SMOOTH to SHARP_SHARP for full interpolation filter search
      reset_interp_filter_allowed_mask(&allowed_interp_mask, REG_REG);
      find_best_interp_rd_facade(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx,
                                 (skip_hor & skip_ver), allowed_interp_mask, 0);
    }
  } else {
    // Evaluate non-dual interp filters
    find_best_non_dual_interp_filter(
        x, cpi, tile_data, bsize, orig_dst, rd, &rd_stats_luma, &rd_stats,
        switchable_rate, dst_bufs, switchable_ctx, skip_ver, skip_hor);
  }
  swap_dst_buf(xd, dst_bufs, num_planes);
  // Recompute final MC data if required
  if (x->recalc_luma_mc_data == 1) {
    // Recomputing final luma MC data is required only if the same was skipped
    // in either of the directions  Condition below is necessary, but not
    // sufficient
    assert((skip_hor == 1) || (skip_ver == 1));
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  // save search results
  if (cpi->sf.interp_sf.use_interp_filter) {
    assert(match_found_idx == -1);
    args->interp_filter_stats_idx = save_interp_filter_search_stat(
        mbmi, *rd, x->pred_sse[ref_frame], args->interp_filter_stats,
        args->interp_filter_stats_idx);
  }
  return 0;
}